

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::SetConfigType(cmCTest *this,char *ct)

{
  string *source;
  char *local_58;
  undefined1 local_38 [8];
  string confTypeEnv;
  char *ct_local;
  cmCTest *this_local;
  
  local_58 = ct;
  if (ct == (char *)0x0) {
    local_58 = "";
  }
  source = &this->ConfigType;
  confTypeEnv.field_2._8_8_ = ct;
  std::__cxx11::string::operator=((string *)source,local_58);
  cmsys::SystemTools::ReplaceString(source,".\\","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "CMAKE_CONFIG_TYPE=",source);
  cmsys::SystemTools::PutEnv
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCTest::SetConfigType(const char* ct)
{
  this->ConfigType = ct ? ct : "";
  cmSystemTools::ReplaceString(this->ConfigType, ".\\", "");
  std::string confTypeEnv = "CMAKE_CONFIG_TYPE=" + this->ConfigType;
  cmSystemTools::PutEnv(confTypeEnv);
}